

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_pcm_rb_uninit(ma_pcm_rb *pRB)

{
  void *pvVar1;
  _func_void_void_ptr_void_ptr *UNRECOVERED_JUMPTABLE;
  
  if ((((pRB != (ma_pcm_rb *)0x0) && ((pRB->rb).ownsBuffer != '\0')) &&
      (pvVar1 = *(void **)((long)(pRB->rb).pBuffer + -8), pvVar1 != (void *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = (pRB->rb).allocationCallbacks.onFree,
     UNRECOVERED_JUMPTABLE != (_func_void_void_ptr_void_ptr *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(pvVar1,(pRB->rb).allocationCallbacks.pUserData);
    return;
  }
  return;
}

Assistant:

MA_API void ma_pcm_rb_uninit(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return;
    }

    ma_data_source_uninit(&pRB->ds);
    ma_rb_uninit(&pRB->rb);
}